

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  IConfig *pIVar4;
  Colour local_19;
  SectionStats *pSStack_18;
  Colour colour;
  SectionStats *_sectionStats_local;
  ConsoleReporter *this_local;
  
  pSStack_18 = _sectionStats;
  if ((_sectionStats->missingAssertions & 1U) != 0) {
    lazyPrint(this);
    Colour::Colour(&local_19,BrightRed);
    sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      (&(this->super_StreamingReporterBase).m_sectionStack);
    if (sVar2 < 2) {
      std::operator<<((this->super_StreamingReporterBase).stream,"\nNo assertions in test case");
    }
    else {
      std::operator<<((this->super_StreamingReporterBase).stream,"\nNo assertions in section");
    }
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream," \'");
    poVar3 = std::operator<<(poVar3,(string *)&pSStack_18->sectionInfo);
    poVar3 = std::operator<<(poVar3,"\'\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Colour::~Colour(&local_19);
  }
  if ((this->m_headerPrinted & 1U) == 0) {
    pIVar4 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    iVar1 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,
                               (string *)&pSStack_18->sectionInfo);
      poVar3 = std::operator<<(poVar3," completed in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pSStack_18->durationInSeconds);
      poVar3 = std::operator<<(poVar3,"s");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pIVar4 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    iVar1 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"Completed in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pSStack_18->durationInSeconds);
      poVar3 = std::operator<<(poVar3,"s");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    this->m_headerPrinted = false;
  }
  StreamingReporterBase::sectionEnded(&this->super_StreamingReporterBase,pSStack_18);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                if( m_sectionStack.size() > 1 )
                    stream << "\nNo assertions in section";
                else
                    stream << "\nNo assertions in test case";
                stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            if( m_headerPrinted ) {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << "Completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
                m_headerPrinted = false;
            }
            else {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << _sectionStats.sectionInfo.name << " completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
            }
            StreamingReporterBase::sectionEnded( _sectionStats );
        }